

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> __thiscall
xemmai::t_parser::f_unary(t_parser *this,bool a_assignable)

{
  t_lexer *this_00;
  int iVar1;
  long lVar2;
  ulong uVar3;
  undefined8 uVar4;
  undefined8 *puVar5;
  long lVar6;
  undefined7 in_register_00000031;
  size_t a_indent;
  undefined4 uVar7;
  undefined8 unaff_R13;
  t_node *a_target;
  uint uVar8;
  undefined1 local_7c [4];
  t_at at;
  undefined1 local_58 [16];
  undefined8 local_48;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  aStack_40;
  
  a_indent = CONCAT71(in_register_00000031,a_assignable);
  this_00 = (t_lexer *)(a_indent + 8);
  iVar1 = *(int *)(a_indent + 0x88);
  if (iVar1 == 1) {
    local_7c = (undefined1  [4])0x37;
    at.v_column = *(size_t *)(a_indent + 0x60);
    at.v_position = *(long *)(a_indent + 0x50);
    at.v_line = *(size_t *)(a_indent + 0x58);
    t_lexer::f_next(this_00);
LAB_00177c65:
    f_unary((t_parser *)local_58,a_assignable);
    std::
    make_unique<xemmai::ast::t_unary,xemmai::t_at&,xemmai::t_instruction&,std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>
              ((t_at *)(local_58 + 8),(t_instruction *)&at,
               (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
               local_7c);
    uVar4 = local_58._8_8_;
    local_58._8_8_ = (t_script *)0x0;
    this->v_module = (t_script *)uVar4;
LAB_00177cd2:
    if ((t_script *)local_58._0_8_ != (t_script *)0x0) {
      (*(((t_script *)local_58._0_8_)->super_t_body)._vptr_t_body[1])();
    }
  }
  else {
    a_target = (t_node *)((*(long *)(a_indent + 0x78) - *(long *)(a_indent + 0x70)) + -0x50 >> 2);
    if (iVar1 == 8) {
      local_7c = (undefined1  [4])0x31;
      uVar7 = 0;
LAB_00177b4e:
      at.v_column = *(size_t *)(a_indent + 0x60);
      at.v_position = *(long *)(a_indent + 0x50);
      at.v_line = *(size_t *)(a_indent + 0x58);
      t_lexer::f_next(this_00);
      if (*(int *)(a_indent + 0x88) == 0x2b) {
        local_48 = *(size_type *)(a_indent + 0xa8);
        aStack_40._M_allocated_capacity = 0;
        t_lexer::f_next(this_00);
        puVar5 = (undefined8 *)operator_new(0x28);
        uVar8 = local_48._4_4_;
        if ((char)uVar7 != '\0') {
          uVar8 = local_48._4_4_ ^ 0x80000000;
        }
        puVar5[1] = at.v_position;
        puVar5[2] = at.v_line;
        puVar5[3] = at.v_column;
        *puVar5 = &PTR__t_node_001ad490;
        puVar5[4] = CONCAT44(uVar8,(undefined4)local_48);
      }
      else {
        if (*(int *)(a_indent + 0x88) != 0x2a) goto LAB_00177c65;
        local_48 = CONCAT44(local_48._4_4_,uVar7);
        lVar2 = *(long *)(a_indent + 0xa8);
        t_lexer::f_next(this_00);
        puVar5 = (undefined8 *)operator_new(0x28);
        lVar6 = -lVar2;
        if ((char)local_48 == '\0') {
          lVar6 = lVar2;
        }
        puVar5[1] = at.v_position;
        puVar5[2] = at.v_line;
        puVar5[3] = at.v_column;
        *puVar5 = &PTR__t_node_001ad448;
        puVar5[4] = lVar6;
      }
    }
    else {
      if (iVar1 != 0x1a) {
        if (iVar1 == 10) {
          uVar7 = (undefined4)CONCAT71((int7)((ulong)unaff_R13 >> 8),1);
          local_7c = (undefined1  [4])0x34;
          goto LAB_00177b4e;
        }
        f_target((t_parser *)&at,a_assignable);
        f_action(this,a_indent,
                 (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
                 a_target,SUB81((t_parser *)&at,0));
        local_58._0_8_ = at.v_position;
        goto LAB_00177cd2;
      }
      local_7c = (undefined1  [4])0x3a;
      at.v_column = *(size_t *)(a_indent + 0x60);
      at.v_position = *(long *)(a_indent + 0x50);
      at.v_line = *(size_t *)(a_indent + 0x58);
      t_lexer::f_next(this_00);
      if (*(int *)(a_indent + 0x88) != 0x2a) goto LAB_00177c65;
      uVar3 = *(ulong *)(a_indent + 0xa8);
      t_lexer::f_next(this_00);
      puVar5 = (undefined8 *)operator_new(0x28);
      puVar5[1] = at.v_position;
      puVar5[2] = at.v_line;
      puVar5[3] = at.v_column;
      *puVar5 = &PTR__t_node_001ad448;
      puVar5[4] = ~uVar3;
    }
    f_action(this,a_indent,a_target,SUB81(puVar5,0));
  }
  return (__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
         )(__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
           )this;
}

Assistant:

std::unique_ptr<ast::t_node> t_parser::f_unary(bool a_assignable)
{
	size_t indent = v_lexer.f_indent();
	t_instruction instruction;
	switch (v_lexer.f_token()) {
	case t_lexer::c_token__PLUS:
		instruction = c_instruction__PLUS_T;
		break;
	case t_lexer::c_token__HYPHEN:
		instruction = c_instruction__MINUS_T;
		break;
	case t_lexer::c_token__EXCLAMATION:
		instruction = c_instruction__NOT_T;
		break;
	case t_lexer::c_token__TILDE:
		instruction = c_instruction__COMPLEMENT_T;
		break;
	default:
		return f_action(indent, f_target(a_assignable), a_assignable);
	}
	t_at at = v_lexer.f_at();
	v_lexer.f_next();
	switch (instruction) {
	case c_instruction__PLUS_T:
	case c_instruction__MINUS_T:
		switch (v_lexer.f_token()) {
		case t_lexer::c_token__INTEGER:
			{
				auto value = v_lexer.f_integer();
				v_lexer.f_next();
				return f_action(indent, new ast::t_literal(at, instruction == c_instruction__MINUS_T ? -value : value), a_assignable);
			}
		case t_lexer::c_token__FLOAT:
			{
				auto value = v_lexer.f_float();
				v_lexer.f_next();
				return f_action(indent, new ast::t_literal(at, instruction == c_instruction__MINUS_T ? -value : value), a_assignable);
			}
		}
		break;
	case c_instruction__COMPLEMENT_T:
		if (v_lexer.f_token() == t_lexer::c_token__INTEGER) {
			auto value = v_lexer.f_integer();
			v_lexer.f_next();
			return f_action(indent, new ast::t_literal(at, ~value), a_assignable);
		}
		break;
	}
	return std::make_unique<ast::t_unary>(at, instruction, f_unary(false));
}